

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

uint __thiscall
BTree<StringBTree,_StringKey>::searchByKey(BTree<StringBTree,_StringKey> *this,StringKey *key)

{
  byte bVar1;
  byte bVar2;
  uint *puVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  KeyCompareOp in_R9;
  uint uVar9;
  bool bVar10;
  SearchResult result;
  SearchResult local_40;
  
  puVar3 = (uint *)this->m_data;
  bVar2 = (byte)*puVar3;
  uVar9 = *puVar3;
  pbVar4 = (byte *)((long)puVar3 +
                   (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8));
  local_40.lowerBound = 0;
  local_40.upperBound = 0;
  local_40.index = 0xffffffff;
  local_40.maxIndex = 0;
  bVar10 = bVar2 == 0;
  uVar9 = (uint)bVar2;
  if (!bVar10) {
    for (pbVar4 = searchWithComparison(this,&local_40,pbVar4,uVar9,key,in_R9); pbVar4 != (byte *)0x0
        ; pbVar4 = searchWithComparison(this,&local_40,pbVar4,(uint)bVar2,key,in_R9)) {
      uVar8 = (ulong)*pbVar4;
      pbVar5 = pbVar4 + 1;
      if ((char)*pbVar4 < '\0') {
        uVar7 = 0x80;
        do {
          uVar6 = (uVar8 - uVar7) * 0x100;
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          uVar8 = bVar1 | uVar6;
          uVar7 = uVar7 << 7;
        } while ((uVar6 & uVar7) != 0);
      }
      local_40.maxIndex = (uint)uVar8;
      uVar8 = (ulong)*pbVar5;
      if ((char)*pbVar5 < '\0') {
        uVar7 = 0x80;
        do {
          uVar6 = (uVar8 - uVar7) * 0x100;
          pbVar4 = pbVar5 + 1;
          pbVar5 = pbVar5 + 1;
          uVar8 = *pbVar4 | uVar6;
          uVar7 = uVar7 << 7;
        } while ((uVar6 & uVar7) != 0);
      }
      uVar7 = (ulong)pbVar5[(uVar8 & 0xffffffff) + 1];
      if ((char)pbVar5[(uVar8 & 0xffffffff) + 1] < '\0') {
        pbVar5 = pbVar5 + (uVar8 & 0xffffffff) + 2;
        uVar8 = 0x80;
        do {
          uVar6 = (uVar7 - uVar8) * 0x100;
          uVar7 = *pbVar5 | uVar6;
          uVar8 = uVar8 << 7;
          pbVar5 = pbVar5 + 1;
        } while ((uVar6 & uVar8) != 0);
      }
      pbVar4 = this->m_data + (uVar7 & 0xffffffff);
      uVar9 = uVar9 - 1;
      bVar10 = uVar9 == 0;
      if (bVar10) break;
    }
  }
  if (bVar10) {
    pbVar4 = searchWithComparison(this,&local_40,pbVar4,0,key,in_R9);
  }
  if (bVar2 == 0) {
    local_40._0_8_ = local_40._0_8_ & 0xffffffff;
  }
  if (pbVar4 == (byte *)0x0) {
    local_40.lowerBound = 0xffffffff;
  }
  else {
    uVar8 = (ulong)*pbVar4;
    pbVar5 = pbVar4 + 1;
    if ((char)*pbVar4 < '\0') {
      uVar7 = 0x80;
      do {
        uVar6 = (uVar8 - uVar7) * 0x100;
        bVar2 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        uVar8 = bVar2 | uVar6;
        uVar7 = uVar7 << 7;
      } while ((uVar6 & uVar7) != 0);
    }
    local_40.lowerBound = (local_40.maxIndex - local_40.upperBound) + local_40.lowerBound;
    key->m_length = (uint)uVar8;
    key->m_value = (char *)pbVar5;
  }
  return local_40.lowerBound;
}

Assistant:

unsigned int searchByKey(Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);
		
		const auto count = static_cast<unsigned int>(readAtWithByteSwap<uint8_t>(m_data, 0));
		const auto offset = readAtWithByteSwap<uint32_t>(m_data, 0) & UINT32_C(0xFFFFFF);
		
		auto data = advancePointer(m_data, offset);
		SearchResult result;
		for (auto i = count; i != 0; i--) {
			data = searchWithComparison(result, data, count, key, &Derived::lessThanKeyCompareOp);
			if (!data)
				goto done;
			
			result.maxIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			
			data = self.advanceData(data);
			
			const auto nextOffset = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			data = advancePointer(m_data, nextOffset);
		}
		
		data = searchWithComparison(result, data, 0, key, &Derived::equalKeyCompareOp);

	done:
		if (count == 0)
			result.upperBound = 0;
			
		if (data) {
			const auto index = (result.maxIndex - result.upperBound + result.lowerBound);
			self.parseData(key, data);
			return index;
		} else {
			return INVALID_INDEX;
		}
	}